

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_highbd_hadamard_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  long in_RDX;
  ptrdiff_t in_RSI;
  int16_t *in_RDI;
  int16_t *tmp_buf;
  int32_t buffer2 [64];
  int16_t buffer [64];
  int idx;
  int16_t *local_1b0;
  int32_t local_1a8 [64];
  int16_t local_a8 [70];
  int local_1c;
  long local_18;
  ptrdiff_t local_10;
  int16_t *local_8;
  
  local_1b0 = local_a8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    hadamard_highbd_col8_first_pass(local_8,local_10,local_1b0);
    local_1b0 = local_1b0 + 8;
    local_8 = local_8 + 1;
  }
  local_1b0 = local_a8;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    hadamard_highbd_col8_second_pass(local_1b0,8,local_1a8 + (local_1c << 3));
    local_1b0 = local_1b0 + 1;
  }
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    *(int32_t *)(local_18 + (long)local_1c * 4) = local_1a8[local_1c];
  }
  return;
}

Assistant:

void aom_highbd_hadamard_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                               tran_low_t *coeff) {
  int idx;
  int16_t buffer[64];
  int32_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // src_diff: 13 bit
    // buffer: 16 bit, dynamic range [-32760, 32760]
    hadamard_highbd_col8_first_pass(src_diff, src_stride, tmp_buf);
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // buffer: 16 bit
    // buffer2: 19 bit, dynamic range [-262080, 262080]
    hadamard_highbd_col8_second_pass(tmp_buf, 8, buffer2 + 8 * idx);
    ++tmp_buf;
  }

  for (idx = 0; idx < 64; ++idx) coeff[idx] = (tran_low_t)buffer2[idx];
}